

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_get_data_format
                    (ma_data_source *pDataSource,ma_format *pFormat,ma_uint32 *pChannels,
                    ma_uint32 *pSampleRate,ma_channel *pChannelMap,size_t channelMapCap)

{
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long *in_RDI;
  void *in_R8;
  size_t in_R9;
  ma_uint32 sampleRate;
  ma_uint32 channels;
  ma_format format;
  ma_result result;
  ma_data_source_base *pDataSourceBase;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58 [2];
  long *local_50;
  size_t local_48;
  void *local_40;
  undefined4 *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  long *local_20;
  ma_result local_14;
  
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = 0;
  }
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  local_50 = in_RDI;
  local_48 = in_R9;
  local_40 = in_R8;
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  if (((in_R8 != (void *)0x0) && (in_R8 != (void *)0x0)) && (in_R9 != 0)) {
    memset(in_R8,0,in_R9);
  }
  if (local_50 == (long *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else if (*(long *)(*local_50 + 0x10) == 0) {
    local_14 = MA_NOT_IMPLEMENTED;
  }
  else {
    local_14 = (**(code **)(*local_50 + 0x10))
                         (local_20,local_58,&local_5c,&local_60,local_40,local_48);
    if (local_14 == MA_SUCCESS) {
      if (local_28 != (undefined4 *)0x0) {
        *local_28 = local_58[0];
      }
      if (local_30 != (undefined4 *)0x0) {
        *local_30 = local_5c;
      }
      if (local_38 != (undefined4 *)0x0) {
        *local_38 = local_60;
      }
      local_14 = MA_SUCCESS;
    }
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_data_source_get_data_format(ma_data_source* pDataSource, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;
    ma_result result;
    ma_format format;
    ma_uint32 channels;
    ma_uint32 sampleRate;

    /* Initialize to defaults for safety just in case the data source does not implement this callback. */
    if (pFormat != NULL) {
        *pFormat = ma_format_unknown;
    }
    if (pChannels != NULL) {
        *pChannels = 0;
    }
    if (pSampleRate != NULL) {
        *pSampleRate = 0;
    }
    if (pChannelMap != NULL) {
        MA_ZERO_MEMORY(pChannelMap, sizeof(*pChannelMap) * channelMapCap);
    }

    if (pDataSourceBase == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ASSERT(pDataSourceBase->vtable != NULL);

    if (pDataSourceBase->vtable->onGetDataFormat == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    result = pDataSourceBase->vtable->onGetDataFormat(pDataSource, &format, &channels, &sampleRate, pChannelMap, channelMapCap);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (pFormat != NULL) {
        *pFormat = format;
    }
    if (pChannels != NULL) {
        *pChannels = channels;
    }
    if (pSampleRate != NULL) {
        *pSampleRate = sampleRate;
    }

    /* Channel map was passed in directly to the callback. This is safe due to the channelMapCap parameter. */

    return MA_SUCCESS;
}